

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  TidyTagId TVar3;
  Node *pNVar4;
  ulong uVar5;
  Node *pNVar6;
  char *property;
  Dict *pDVar7;
  bool bVar8;
  Node *lastli;
  TidyParserMemory memory;
  
  pLVar1 = doc->lexer;
  lastli = (Node *)0x0;
  if (list == (Node *)0x0) {
    prvTidypopMemory(doc);
    bVar8 = false;
    list = memory.original_node;
  }
  else {
    pDVar7 = list->tag;
    if (pDVar7 == (Dict *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = pDVar7->id == TidyTag_OL;
    }
    if ((pDVar7->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  pLVar1->insert = (IStack *)0x0;
  do {
    do {
      pNVar4 = prvTidyGetToken(doc,IgnoreWhitespace);
      if (pNVar4 == (Node *)0x0) {
        prvTidyReport(doc,list,(Node *)0x0,0x25a);
        return (Node *)0x0;
      }
      if ((pNVar4->tag == list->tag) && (pNVar4->type == EndTag)) {
        prvTidyFreeNode(doc,pNVar4);
        list->closed = yes;
        return (Node *)0x0;
      }
      BVar2 = InsertMisc(list,pNVar4);
    } while (BVar2 != no);
    if (pNVar4->type == TextNode) {
      if (pLVar1 == (Lexer *)0x0) {
        pDVar7 = pNVar4->tag;
LAB_00139d5a:
        if (pDVar7 == (Dict *)0x0) {
          if (bVar8) goto LAB_00139d79;
          bVar8 = false;
LAB_00139da1:
          BVar2 = prvTidyIsHTML5Mode(doc);
          if ((BVar2 == no) || (bVar8)) {
            prvTidyUngetToken(doc);
            BVar2 = prvTidynodeHasCM(pNVar4,8);
            if ((BVar2 != no) && (pLVar1->excludeBlocks != no)) {
              prvTidyReport(doc,list,pNVar4,0x259);
              return (Node *)0x0;
            }
            if (pLVar1->exiled != no) {
              BVar2 = prvTidynodeHasCM(pNVar4,0x380);
              if (BVar2 != no) {
                return (Node *)0x0;
              }
              if ((pNVar4->tag != (Dict *)0x0) && (pNVar4->tag->id == TidyTag_TABLE)) {
                return (Node *)0x0;
              }
            }
            if ((((list != (Node *)0x0) && (list->tag != (Dict *)0x0)) &&
                (list->tag->id == TidyTag_OL)) && (BVar2 = FindLastLI(list,&lastli), BVar2 != no)) {
              pNVar4 = prvTidyInferredTag(doc,TidyTag_LI);
              prvTidyReport(doc,list,pNVar4,0x261);
              prvTidyFreeNode(doc,pNVar4);
              pNVar4 = lastli;
              goto LAB_00139ed1;
            }
            BVar2 = prvTidynodeHasCM(pNVar4,8);
            pNVar4 = prvTidyInferredTag(doc,TidyTag_LI);
            property = "list-style: none; display: inline";
            if (BVar2 == no) {
              property = "list-style: none";
            }
            prvTidyAddStyleProperty(doc,pNVar4,property);
            prvTidyReport(doc,list,pNVar4,0x261);
          }
        }
        else {
          TVar3 = pDVar7->id;
          if ((bool)(TVar3 != TidyTag_LI & bVar8)) {
LAB_00139d79:
            BVar2 = FindLastLI(list,&lastli);
            bVar8 = BVar2 != no;
            if (pDVar7 == (Dict *)0x0) goto LAB_00139da1;
            TVar3 = pDVar7->id;
          }
          else {
            bVar8 = false;
          }
          if (TVar3 != TidyTag_LI) goto LAB_00139da1;
        }
        prvTidyInsertNodeAtEnd(list,pNVar4);
LAB_00139ed1:
        memory.reentry_mode = IgnoreWhitespace;
        memory.reentry_state = 0;
        memory.mode = IgnoreWhitespace;
        memory.register_1 = 0;
        memory.register_2 = 0;
        memory._44_4_ = 0;
        memory.identity = prvTidyParseList;
        memory.original_node = list;
        memory.reentry_node = pNVar4;
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT2448(CONCAT816(pNVar4,CONCAT88(list,prvTidyParseList))));
        return pNVar4;
      }
      for (uVar5 = (ulong)pNVar4->start; uVar5 < pNVar4->end; uVar5 = uVar5 + 1) {
        if ((0x20 < (ulong)(byte)pLVar1->lexbuf[uVar5]) ||
           ((0x100002600U >> ((ulong)(byte)pLVar1->lexbuf[uVar5] & 0x3f) & 1) == 0)) {
          pDVar7 = pNVar4->tag;
          goto LAB_00139c65;
        }
      }
    }
    else {
      pDVar7 = pNVar4->tag;
      if (pDVar7 != (Dict *)0x0) {
LAB_00139c65:
        if (pNVar4->type != EndTag) goto LAB_00139d5a;
        if ((pDVar7 == (Dict *)0x0) || (pDVar7->id != TidyTag_FORM)) {
          BVar2 = prvTidynodeHasCM(pNVar4,0x10);
          pNVar6 = list;
          if (BVar2 != no) {
            prvTidyReport(doc,list,pNVar4,0x235);
            prvTidyPopInline(doc,pNVar4);
            goto LAB_00139cca;
          }
          while ((pNVar6 = pNVar6->parent, pNVar6 != (Node *)0x0 &&
                 ((pDVar7 = pNVar6->tag, pDVar7 == (Dict *)0x0 || (pDVar7->id != TidyTag_BODY))))) {
            if (pNVar4->tag == pDVar7) {
              prvTidyReport(doc,list,pNVar4,0x259);
              prvTidyUngetToken(doc);
              return (Node *)0x0;
            }
          }
        }
        else {
          *(byte *)&doc->badForm = (byte)doc->badForm | 1;
        }
      }
      prvTidyReport(doc,list,pNVar4,0x235);
    }
LAB_00139cca:
    prvTidyFreeNode(doc,pNVar4);
  } while( true );
}

Assistant:

Node* TY_(ParseList)( TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    Node *lastli = NULL;;
    Bool wasblock = no;
    Bool nodeisOL = nodeIsOL(list);
    DEBUG_LOG_COUNTERS;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);

        if (list->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within
               the last <li> to preserve the numbering to match the visual
               rendering of most browsers. */
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none"
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseList);
            memory.original_node = list;
            memory.reentry_node = node;
            memory.mode = IgnoreWhitespace;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}